

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall crnlib::dxt_hc::~dxt_hc(dxt_hc *this)

{
  color_quad<unsigned_char,_int> *pcVar1;
  void *pvVar2;
  selector_indices_details *p;
  endpoint_indices_details *p_00;
  uint *puVar3;
  bool *pbVar4;
  unsigned_long_long *p_01;
  uchar *p_02;
  float *p_03;
  tile_details *ptVar5;
  ulong uVar6;
  long lVar7;
  alpha_cluster *paVar8;
  color_cluster *pcVar9;
  alpha_cluster *paVar10;
  color_cluster *pcVar11;
  
  paVar8 = (this->m_alpha_clusters).m_p;
  if (paVar8 != (alpha_cluster *)0x0) {
    uVar6 = (ulong)(this->m_alpha_clusters).m_size;
    if (uVar6 != 0) {
      paVar10 = paVar8 + uVar6;
      do {
        pcVar1 = (paVar8->pixels).m_p;
        if (pcVar1 != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(pcVar1);
        }
        lVar7 = 0x30;
        do {
          pvVar2 = *(void **)((long)(paVar8->blocks + -1) + lVar7);
          if (pvVar2 != (void *)0x0) {
            crnlib_free(pvVar2);
          }
          lVar7 = lVar7 + -0x10;
        } while (lVar7 != 0);
        paVar8 = paVar8 + 1;
      } while (paVar8 != paVar10);
    }
    crnlib_free((this->m_alpha_clusters).m_p);
  }
  pcVar9 = (this->m_color_clusters).m_p;
  if (pcVar9 != (color_cluster *)0x0) {
    uVar6 = (ulong)(this->m_color_clusters).m_size;
    if (uVar6 != 0) {
      pcVar11 = pcVar9 + uVar6;
      do {
        pcVar1 = (pcVar9->pixels).m_p;
        if (pcVar1 != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(pcVar1);
        }
        lVar7 = 0x30;
        do {
          pvVar2 = *(void **)((long)(pcVar9->blocks + -1) + lVar7);
          if (pvVar2 != (void *)0x0) {
            crnlib_free(pvVar2);
          }
          lVar7 = lVar7 + -0x10;
        } while (lVar7 != 0);
        pcVar9 = pcVar9 + 1;
      } while (pcVar9 != pcVar11);
    }
    crnlib_free((this->m_color_clusters).m_p);
  }
  p = (this->m_selector_indices).m_p;
  if (p != (selector_indices_details *)0x0) {
    crnlib_free(p);
  }
  p_00 = (this->m_endpoint_indices).m_p;
  if (p_00 != (endpoint_indices_details *)0x0) {
    crnlib_free(p_00);
  }
  puVar3 = (this->m_tile_indices).m_p;
  if (puVar3 != (uint *)0x0) {
    crnlib_free(puVar3);
  }
  pbVar4 = (this->m_alpha_selectors_used).m_p;
  if (pbVar4 != (bool *)0x0) {
    crnlib_free(pbVar4);
  }
  pbVar4 = (this->m_color_selectors_used).m_p;
  if (pbVar4 != (bool *)0x0) {
    crnlib_free(pbVar4);
  }
  p_01 = (this->m_alpha_selectors).m_p;
  if (p_01 != (unsigned_long_long *)0x0) {
    crnlib_free(p_01);
  }
  puVar3 = (this->m_color_selectors).m_p;
  if (puVar3 != (uint *)0x0) {
    crnlib_free(puVar3);
  }
  lVar7 = 0x688;
  do {
    pvVar2 = *(void **)((long)(this->m_color_derating + -1) + 0xc + lVar7);
    if (pvVar2 != (void *)0x0) {
      crnlib_free(pvVar2);
    }
    lVar7 = lVar7 + -0x10;
  } while (lVar7 != 0x658);
  p_02 = (this->m_block_encodings).m_p;
  if (p_02 != (uchar *)0x0) {
    crnlib_free(p_02);
  }
  p_03 = (this->m_block_weights).m_p;
  if (p_03 != (float *)0x0) {
    crnlib_free(p_03);
  }
  ptVar5 = (this->m_tiles).m_p;
  if (ptVar5 != (tile_details *)0x0) {
    uVar6 = (ulong)(this->m_tiles).m_size;
    if (uVar6 != 0) {
      lVar7 = 0;
      do {
        pvVar2 = *(void **)((long)(ptVar5->color_endpoint).m_s + lVar7 + -0x14);
        if (pvVar2 != (void *)0x0) {
          crnlib_free(pvVar2);
        }
        lVar7 = lVar7 + 0x48;
      } while (uVar6 * 0x48 != lVar7);
    }
    crnlib_free((this->m_tiles).m_p);
  }
  return;
}

Assistant:

dxt_hc::~dxt_hc()
    {
    }